

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesDH41
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  long lVar2;
  uint8_t *puVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  BrotliEncoderDictionary *pBVar7;
  void *pvVar8;
  PreparedDictionary *pPVar9;
  void *pvVar10;
  HasherCommon *pHVar11;
  BrotliDictionary *pBVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  uint32_t *puVar17;
  ushort uVar18;
  uint32_t uVar19;
  uint32_t *puVar20;
  ulong *puVar21;
  long lVar22;
  ulong uVar23;
  uint32_t *puVar24;
  ulong *puVar25;
  byte bVar26;
  ulong uVar27;
  uint8_t *puVar28;
  ulong *puVar29;
  ulong *puVar30;
  int iVar31;
  uint32_t *puVar32;
  uint32_t *puVar33;
  uint32_t *puVar34;
  ulong *puVar35;
  BankH41 *banks;
  uint8_t *puVar36;
  size_t sVar37;
  size_t key;
  ulong uVar38;
  uint32_t *puVar39;
  uint32_t *puVar40;
  uint32_t *puVar41;
  uint8_t *puVar42;
  uint16_t uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint *puVar47;
  uint32_t *puVar48;
  byte bVar49;
  ushort uVar50;
  long lVar51;
  undefined8 *puVar52;
  uint32_t *puVar53;
  char cVar54;
  uint32_t *puVar55;
  uint32_t *puVar56;
  ulong uVar57;
  uint8_t uVar58;
  uint8_t *puVar59;
  uint8_t *puVar60;
  ulong uVar61;
  uint32_t *addr;
  uint32_t *puVar62;
  uint8_t *s1_orig_2;
  uint32_t *puVar63;
  size_t sVar64;
  bool bVar65;
  uint32_t *local_170;
  ulong local_160;
  int local_154;
  int local_150;
  uint32_t *local_148;
  uint32_t *local_140;
  uint32_t *local_130;
  uint32_t *local_128;
  uint32_t *local_120;
  uint8_t *local_110;
  uint8_t *local_f8;
  uint32_t *local_f0;
  size_t local_e8;
  uint32_t *local_e0;
  uint8_t *local_d0;
  Command *local_b8;
  ulong local_a8;
  uint local_94;
  uint8_t *s1_orig_1;
  int last_distance;
  
  iVar31 = params->lgwin;
  sVar5 = params->stream_offset;
  local_e8 = *last_insert_len;
  puVar20 = (uint32_t *)((position - 3) + num_bytes);
  if (num_bytes < 4) {
    puVar20 = (uint32_t *)position;
  }
  puVar3 = (uint8_t *)(position + num_bytes);
  lVar51 = 0x200;
  if (params->quality < 9) {
    lVar51 = 0x40;
  }
  sVar6 = (params->dictionary).compound.total_size;
  iVar4 = *dist_cache;
  dist_cache[4] = iVar4 + -1;
  dist_cache[5] = iVar4 + 1;
  dist_cache[6] = iVar4 + -2;
  dist_cache[7] = iVar4 + 2;
  *(ulong *)(dist_cache + 8) = CONCAT44(iVar4 + 3,iVar4 + -3);
  if ((uint8_t *)(position + 4) < puVar3) {
    puVar32 = (uint32_t *)((1L << ((byte)iVar31 & 0x3f)) + -0x10);
    local_d0 = (uint8_t *)(lVar51 + position);
    lVar1 = sVar6 + 1;
    local_b8 = commands;
    local_130 = (uint32_t *)position;
    do {
      puVar39 = puVar32;
      if (local_130 < puVar32) {
        puVar39 = local_130;
      }
      puVar40 = (uint32_t *)((long)local_130 + sVar5);
      if (puVar32 <= (uint32_t *)((long)local_130 + sVar5)) {
        puVar40 = puVar32;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_94 = 0;
        local_a8 = 0;
      }
      else {
        if (local_130 == (uint32_t *)0x0) {
          local_a8 = 0;
        }
        else {
          local_a8 = (ulong)ringbuffer[(ulong)((long)local_130 - 1U) & ringbuffer_mask];
        }
        if (local_130 < (uint32_t *)0x2) {
          uVar27 = 0;
        }
        else {
          uVar27 = (ulong)ringbuffer[(ulong)((long)local_130 - 2U) & ringbuffer_mask];
        }
        local_94 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar27 + 0x100] | literal_context_lut[local_a8]];
      }
      local_140 = (uint32_t *)(puVar3 + -(long)local_130);
      pBVar7 = (params->dictionary).contextual.dict[local_94];
      puVar42 = (uint8_t *)(params->dist).max_distance;
      puVar33 = (uint32_t *)(hasher->privat)._H40.extra[0];
      pvVar8 = (hasher->privat)._H40.extra[1];
      uVar27 = (ulong)local_130 & ringbuffer_mask;
      puVar21 = (ulong *)(ringbuffer + uVar27);
      uVar44 = (uint)(*(int *)(ringbuffer + uVar27) * 0x1e35a7bd) >> 0x11;
      local_f0 = (uint32_t *)0x7e4;
      puVar62 = (uint32_t *)0x0;
      lVar22 = 0;
      local_170 = (uint32_t *)0x0;
      local_110 = (uint8_t *)0x0;
      local_120 = (uint32_t *)0x7e4;
      do {
        puVar36 = (uint8_t *)(long)dist_cache[lVar22];
        puVar28 = (uint8_t *)((long)local_130 - (long)puVar36);
        uVar58 = (uint8_t)uVar44;
        if ((((lVar22 == 0) ||
             (*(uint8_t *)((long)puVar33 + ((ulong)puVar28 & 0xffff) + 0x30000) == uVar58)) &&
            (puVar36 <= puVar39)) && (puVar28 < local_130)) {
          puVar29 = (ulong *)(ringbuffer + ((ulong)puVar28 & ringbuffer_mask));
          puVar35 = puVar21;
          puVar30 = puVar29;
          puVar63 = local_130;
          for (puVar55 = local_140; (uint32_t *)0x7 < puVar55; puVar55 = puVar55 + -2) {
            uVar23 = *puVar35;
            uVar38 = *puVar30;
            if (uVar23 == uVar38) {
              puVar30 = puVar30 + 1;
            }
            else {
              uVar57 = 0;
              if ((uVar38 ^ uVar23) != 0) {
                for (; ((uVar38 ^ uVar23) >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                }
              }
              puVar63 = (uint32_t *)((long)puVar30 + ((uVar57 >> 3 & 0x1fffffff) - (long)puVar29));
            }
            if (uVar23 != uVar38) goto LAB_0030775c;
            puVar35 = puVar35 + 1;
          }
          puVar25 = puVar30;
          if (puVar55 != (uint32_t *)0x0) {
            puVar25 = (ulong *)((long)puVar30 + (long)puVar55);
            puVar28 = (uint8_t *)0x0;
            do {
              if (*(uint8_t *)((long)puVar30 + (long)puVar28) !=
                  *(uint8_t *)((long)puVar35 + (long)puVar28)) {
                puVar25 = (ulong *)((long)puVar30 + (long)puVar28);
                break;
              }
              puVar28 = puVar28 + 1;
            } while (puVar55 != (uint32_t *)puVar28);
          }
          puVar63 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_0030775c:
          if (((uint32_t *)0x1 < puVar63) &&
             (puVar55 = (uint32_t *)((long)puVar63 * 0x87 + 0x78f), local_f0 < puVar55)) {
            if (lVar22 != 0) {
              puVar55 = (uint32_t *)
                        ((long)puVar55 - (ulong)((0x1ca10U >> ((byte)lVar22 & 0xe) & 0xe) + 0x27));
            }
            if (local_f0 < puVar55) {
              local_170 = puVar63;
              local_120 = puVar55;
              puVar62 = puVar63;
              local_110 = puVar36;
              local_f0 = puVar55;
            }
          }
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != 10);
      uVar38 = (ulong)uVar44;
      sVar64 = (hasher->privat)._H5.block_size_;
      uVar57 = (long)local_130 - (ulong)puVar33[uVar38];
      uVar23 = (ulong)*(ushort *)((long)puVar33 + uVar38 * 2 + 0x20000);
      puVar28 = (uint8_t *)0x0;
      local_160 = uVar57;
      do {
        bVar65 = sVar64 == 0;
        sVar64 = sVar64 - 1;
        if (bVar65) break;
        puVar28 = puVar28 + local_160;
        if (puVar28 <= puVar39) {
          uVar61 = (ulong)*(ushort *)((long)pvVar8 + uVar23 * 4 + 2);
          local_160 = (ulong)*(ushort *)((long)pvVar8 + uVar23 * 4);
          uVar23 = uVar61;
          if ((uint8_t *)((long)puVar62 + uVar27) <= ringbuffer_mask) {
            uVar61 = (long)local_130 - (long)puVar28 & ringbuffer_mask;
            puVar36 = (uint8_t *)((long)puVar62 + uVar61);
            if ((puVar36 <= ringbuffer_mask) &&
               (ringbuffer[(long)((long)puVar62 + uVar27)] == ringbuffer[(long)puVar36])) {
              puVar29 = (ulong *)(ringbuffer + uVar61);
              puVar35 = puVar21;
              puVar30 = puVar29;
              puVar63 = (uint32_t *)ringbuffer;
              for (puVar55 = local_140; (uint32_t *)0x7 < puVar55; puVar55 = puVar55 + -2) {
                uVar61 = *puVar35;
                uVar15 = *puVar30;
                if (uVar61 == uVar15) {
                  puVar30 = puVar30 + 1;
                }
                else {
                  uVar14 = 0;
                  if ((uVar15 ^ uVar61) != 0) {
                    for (; ((uVar15 ^ uVar61) >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                    }
                  }
                  puVar63 = (uint32_t *)
                            ((long)puVar30 + ((uVar14 >> 3 & 0x1fffffff) - (long)puVar29));
                }
                if (uVar61 != uVar15) goto LAB_00307946;
                puVar35 = puVar35 + 1;
              }
              if (puVar55 != (uint32_t *)0x0) {
                puVar63 = (uint32_t *)0x0;
                do {
                  puVar24 = puVar63;
                  if (*(uint8_t *)((long)puVar30 + (long)puVar63) !=
                      *(uint8_t *)((long)puVar35 + (long)puVar63)) break;
                  puVar63 = (uint32_t *)((long)puVar63 + 1);
                  puVar24 = puVar55;
                } while (puVar55 != puVar63);
                puVar30 = (ulong *)((long)puVar30 + (long)puVar24);
              }
              puVar63 = (uint32_t *)((long)puVar30 - (long)puVar29);
LAB_00307946:
              if ((uint32_t *)0x3 < puVar63) {
                iVar31 = 0x1f;
                if ((uint)puVar28 != 0) {
                  for (; (uint)puVar28 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                  }
                }
                puVar55 = (uint32_t *)((ulong)(iVar31 * -0x1e + 0x780) + (long)puVar63 * 0x87);
                if (local_f0 < puVar55) {
                  local_120 = puVar55;
                  puVar62 = puVar63;
                  local_170 = puVar63;
                  local_110 = puVar28;
                  local_f0 = puVar55;
                }
              }
            }
          }
        }
      } while (puVar28 <= puVar39);
      uVar50 = (hasher->privat)._H42.free_slot_idx[0];
      (hasher->privat)._H42.free_slot_idx[0] = uVar50 + 1;
      if (0xfffe < uVar57) {
        uVar57 = 0xffff;
      }
      *(uint8_t *)((long)puVar33 + ((ulong)local_130 & 0xffff) + 0x30000) = uVar58;
      *(short *)((long)pvVar8 + (ulong)uVar50 * 4) = (short)uVar57;
      *(undefined2 *)((long)pvVar8 + (ulong)uVar50 * 4 + 2) =
           *(undefined2 *)((long)puVar33 + uVar38 * 2 + 0x20000);
      puVar33[uVar38] = (uint32_t)local_130;
      *(ushort *)((long)puVar33 + uVar38 * 2 + 0x20000) = uVar50;
      local_154 = 0;
      local_e0 = local_170;
      local_128 = local_120;
      if ((local_120 == (uint32_t *)0x7e4) &&
         (puVar33 = *(uint32_t **)&(hasher->privat)._H65.ha.num_last_distances_to_check_,
         *(ulong *)(puVar33 + 10) >> 7 <= *(ulong *)(puVar33 + 0xc))) {
        uVar23 = (ulong)((uint)((int)*puVar21 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        puVar28 = pBVar7->hash_table_lengths;
        lVar22 = *(long *)(puVar33 + 10);
        local_154 = 0;
        puVar39 = (uint32_t *)ringbuffer_mask;
        puVar62 = (uint32_t *)0x0;
        do {
          lVar22 = lVar22 + 1;
          *(long *)(puVar33 + 10) = lVar22;
          bVar26 = puVar28[uVar23];
          puVar36 = (uint8_t *)(ulong)bVar26;
          if (puVar36 != (uint8_t *)0x0) {
            bVar65 = true;
            if (puVar36 <= local_140) {
              pBVar12 = pBVar7->words;
              puVar30 = (ulong *)(pBVar12->data +
                                 (ulong)pBVar12->offsets_by_length[(long)puVar36] +
                                 (ulong)pBVar7->hash_table_words[uVar23] * (long)puVar36);
              puVar35 = puVar21;
              puVar59 = puVar36;
              if (7 < bVar26) {
                do {
                  uVar38 = *puVar30;
                  uVar57 = *puVar35;
                  if (uVar38 == uVar57) {
                    puVar35 = puVar35 + 1;
                  }
                  else {
                    uVar61 = 0;
                    if ((uVar57 ^ uVar38) != 0) {
                      for (; ((uVar57 ^ uVar38) >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
                      }
                    }
                    puVar39 = (uint32_t *)
                              ((long)puVar35 + ((uVar61 >> 3 & 0x1fffffff) - (long)puVar21));
                  }
                  if (uVar38 != uVar57) goto LAB_00308b2e;
                  puVar30 = puVar30 + 1;
                  puVar59 = puVar59 + -8;
                } while ((uint8_t *)0x7 < puVar59);
              }
              puVar29 = puVar35;
              if (puVar59 != (uint8_t *)0x0) {
                puVar29 = (ulong *)((long)puVar35 + (long)puVar59);
                puVar60 = (uint8_t *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar35 + (long)puVar60) !=
                      *(uint8_t *)((long)puVar30 + (long)puVar60)) {
                    puVar29 = (ulong *)((long)puVar35 + (long)puVar60);
                    break;
                  }
                  puVar60 = puVar60 + 1;
                } while (puVar59 != puVar60);
              }
              puVar39 = (uint32_t *)((long)puVar29 - (long)puVar21);
LAB_00308b2e:
              bVar65 = true;
              if (((puVar39 != (uint32_t *)0x0) &&
                  (puVar36 < (uint8_t *)((long)puVar39 + (ulong)pBVar7->cutoffTransformsCount))) &&
                 (puVar36 = (uint8_t *)
                            ((long)puVar40 +
                            ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                           ((char)((long)puVar36 - (long)puVar39) * '\x06' & 0x3fU))
                                    & 0x3f) + ((long)puVar36 - (long)puVar39) * 4 <<
                            (puVar36[(long)pBVar12] & 0x3f)) +
                            (ulong)pBVar7->hash_table_words[uVar23] + lVar1), puVar36 <= puVar42)) {
                iVar31 = 0x1f;
                if ((uint)puVar36 != 0) {
                  for (; (uint)puVar36 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                  }
                }
                puVar55 = (uint32_t *)
                          (((long)puVar39 * 0x87 - (ulong)(uint)(iVar31 * 0x1e)) + 0x780);
                if (local_128 <= puVar55) {
                  local_154 = (uint)bVar26 - (int)puVar39;
                  bVar65 = false;
                  local_170 = puVar39;
                  local_128 = puVar55;
                  local_110 = puVar36;
                }
              }
            }
            if (!bVar65) {
              *(long *)(puVar33 + 0xc) = *(long *)(puVar33 + 0xc) + 1;
            }
          }
          local_120 = (uint32_t *)((long)puVar62 + 1);
          uVar23 = uVar23 + 1;
          bVar65 = puVar62 == (uint32_t *)0x0;
          puVar62 = local_120;
          local_e0 = local_170;
        } while (bVar65);
      }
      puVar42 = (uint8_t *)(params->dictionary).compound.num_chunks;
      if (puVar42 != (uint8_t *)0x0) {
        local_120 = (uint32_t *)0x0;
        do {
          pPVar9 = (params->dictionary).compound.chunks[(long)local_120];
          bVar26 = (byte)pPVar9->bucket_bits;
          bVar49 = (byte)pPVar9->slot_bits;
          bVar16 = -(char)pPVar9->hash_bits;
          uVar23 = ((*puVar21 << (bVar16 & 0x3f)) >> (bVar16 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                   (-bVar26 & 0x3f);
          lVar22 = (1L << (bVar49 & 0x3f)) * 4;
          lVar2 = (1L << (bVar26 & 0x3f)) * 2;
          bVar49 = -bVar49;
          puVar52 = (undefined8 *)
                    ((long)&pPVar9[1].magic + (ulong)pPVar9->num_items * 4 + lVar2 + lVar22);
          if (pPVar9->magic != 0xdebcede0) {
            puVar52 = (undefined8 *)*puVar52;
          }
          puVar28 = (uint8_t *)
                    ((long)puVar40 +
                    ((params->dictionary).compound.total_size -
                    (params->dictionary).compound.chunk_offsets[(long)local_120]));
          uVar38 = (ulong)pPVar9->source_size;
          uVar50 = *(ushort *)((long)&pPVar9[1].magic + (uVar23 & 0xffffffff) * 2 + lVar22);
          puVar47 = (uint *)((long)&pPVar9[1].magic +
                            (ulong)((uint)uVar50 +
                                   (&pPVar9[1].magic)
                                   [(uint)((int)uVar23 << (bVar49 & 0x1f)) >> (bVar49 & 0x1f)]) * 4
                            + lVar2 + lVar22);
          lVar22 = 0;
          local_170 = local_e0;
          do {
            puVar36 = (uint8_t *)(long)dist_cache[lVar22];
            if ((puVar28 + -uVar38 < puVar36) && (puVar36 <= puVar28)) {
              puVar39 = (uint32_t *)(uVar38 - ((long)puVar28 - (long)puVar36));
              if (local_140 <= puVar39) {
                puVar39 = local_140;
              }
              puVar29 = (ulong *)(((long)puVar28 - (long)puVar36) + (long)puVar52);
              puVar35 = puVar21;
              puVar30 = puVar29;
              for (; (uint32_t *)0x7 < puVar39; puVar39 = puVar39 + -2) {
                uVar23 = *puVar35;
                uVar57 = *puVar30;
                if (uVar23 == uVar57) {
                  puVar30 = puVar30 + 1;
                }
                else {
                  uVar61 = 0;
                  if ((uVar57 ^ uVar23) != 0) {
                    for (; ((uVar57 ^ uVar23) >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
                    }
                  }
                  puVar33 = (uint32_t *)
                            ((long)puVar30 + ((uVar61 >> 3 & 0x1fffffff) - (long)puVar29));
                }
                if (uVar23 != uVar57) goto LAB_00307be4;
                puVar35 = puVar35 + 1;
              }
              puVar25 = puVar30;
              if (puVar39 != (uint32_t *)0x0) {
                puVar25 = (ulong *)((long)puVar30 + (long)puVar39);
                puVar59 = (uint8_t *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar30 + (long)puVar59) !=
                      *(uint8_t *)((long)puVar35 + (long)puVar59)) {
                    puVar25 = (ulong *)((long)puVar30 + (long)puVar59);
                    break;
                  }
                  puVar59 = puVar59 + 1;
                } while (puVar39 != (uint32_t *)puVar59);
              }
              puVar33 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_00307be4:
              if (((uint32_t *)0x1 < puVar33) &&
                 (puVar39 = (uint32_t *)((long)puVar33 * 0x87 + 0x78f), local_128 < puVar39)) {
                if (lVar22 != 0) {
                  puVar39 = (uint32_t *)
                            ((long)puVar39 - (ulong)((0x1ca10U >> ((byte)lVar22 & 2) & 4) + 0x27));
                }
                if (local_128 < puVar39) {
                  if (local_170 < puVar33) {
                    local_170 = puVar33;
                  }
                  local_154 = 0;
                  local_128 = puVar39;
                  local_110 = puVar36;
                  local_e0 = puVar33;
                }
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != 4);
          puVar39 = (uint32_t *)0x4;
          if (uVar50 != 0xffff) {
            do {
              uVar44 = *puVar47;
              uVar23 = (ulong)(uVar44 & 0x7fffffff);
              puVar36 = puVar28 + -uVar23;
              puVar62 = (uint32_t *)(uVar38 - uVar23);
              if (local_140 <= (uint32_t *)(uVar38 - uVar23)) {
                puVar62 = local_140;
              }
              if ((((puVar36 <= (uint8_t *)(params->dist).max_distance) &&
                   ((uint8_t *)((long)local_170 + uVar27) <= ringbuffer_mask)) &&
                  (local_170 < puVar62)) &&
                 (ringbuffer[(long)((long)local_170 + uVar27)] ==
                  *(uint8_t *)((long)puVar52 + (long)((long)local_170 + uVar23)))) {
                puVar29 = (ulong *)(uVar23 + (long)puVar52);
                puVar35 = puVar21;
                puVar30 = puVar29;
                for (; (uint32_t *)0x7 < puVar62; puVar62 = puVar62 + -2) {
                  puVar33 = (uint32_t *)*puVar35;
                  puVar59 = (uint8_t *)*puVar30;
                  if (puVar33 == (uint32_t *)puVar59) {
                    puVar30 = puVar30 + 1;
                  }
                  else {
                    uVar23 = 0;
                    if (((ulong)puVar59 ^ (ulong)puVar33) != 0) {
                      for (; (((ulong)puVar59 ^ (ulong)puVar33) >> uVar23 & 1) == 0;
                          uVar23 = uVar23 + 1) {
                      }
                    }
                    puVar39 = (uint32_t *)
                              ((long)puVar30 + ((uVar23 >> 3 & 0x1fffffff) - (long)puVar29));
                  }
                  if (puVar33 != (uint32_t *)puVar59) goto LAB_00307d58;
                  puVar35 = puVar35 + 1;
                }
                puVar25 = puVar30;
                if (puVar62 != (uint32_t *)0x0) {
                  puVar25 = (ulong *)((long)puVar30 + (long)puVar62);
                  puVar59 = (uint8_t *)0x0;
                  do {
                    if (*(uint8_t *)((long)puVar30 + (long)puVar59) !=
                        *(uint8_t *)((long)puVar35 + (long)puVar59)) {
                      puVar25 = (ulong *)((long)puVar30 + (long)puVar59);
                      break;
                    }
                    puVar59 = puVar59 + 1;
                  } while (puVar62 != (uint32_t *)puVar59);
                }
                puVar39 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_00307d58:
                if ((uint32_t *)0x3 < puVar39) {
                  iVar31 = 0x1f;
                  if ((uint)puVar36 != 0) {
                    for (; (uint)puVar36 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                    }
                  }
                  puVar62 = (uint32_t *)((ulong)(iVar31 * -0x1e + 0x780) + (long)puVar39 * 0x87);
                  if (local_128 < puVar62) {
                    local_154 = 0;
                    local_170 = puVar39;
                    local_128 = puVar62;
                    local_110 = puVar36;
                    local_e0 = puVar39;
                  }
                }
              }
              puVar47 = puVar47 + 1;
            } while (-1 < (int)uVar44);
          }
          local_120 = (uint32_t *)((long)local_120 + 1);
        } while (local_120 != (uint32_t *)puVar42);
      }
      if (local_128 < (uint32_t *)0x7e5) {
        local_e8 = local_e8 + 1;
        position = (long)local_130 + 1;
        if (local_d0 < position) {
          if (local_d0 + (uint)((int)lVar51 * 4) < position) {
            puVar42 = (uint8_t *)((long)local_130 + 0x11);
            if (puVar3 + -4 <= (uint8_t *)((long)local_130 + 0x11)) {
              puVar42 = puVar3 + -4;
            }
            if (puVar42 <= position) goto LAB_0030903c;
            pvVar8 = (hasher->privat)._H40.extra[0];
            pvVar10 = (hasher->privat)._H40.extra[1];
            uVar50 = (hasher->privat)._H42.free_slot_idx[0];
            do {
              uVar44 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar27 = (ulong)uVar44;
              uVar23 = position - *(uint *)((long)pvVar8 + uVar27 * 4);
              *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar44;
              if (0xfffe < uVar23) {
                uVar23 = 0xffff;
              }
              uVar18 = uVar50 + 1;
              *(short *)((long)pvVar10 + (ulong)uVar50 * 4) = (short)uVar23;
              *(undefined2 *)((long)pvVar10 + (ulong)uVar50 * 4 + 2) =
                   *(undefined2 *)((long)pvVar8 + uVar27 * 2 + 0x20000);
              *(int *)((long)pvVar8 + uVar27 * 4) = (int)position;
              *(ushort *)((long)pvVar8 + uVar27 * 2 + 0x20000) = uVar50;
              local_e8 = local_e8 + 4;
              position = position + 4;
              uVar50 = uVar18;
            } while (position < puVar42);
            goto LAB_00309015;
          }
          puVar42 = (uint8_t *)((long)local_130 + 9);
          if (puVar3 + -3 <= (uint8_t *)((long)local_130 + 9)) {
            puVar42 = puVar3 + -3;
          }
          if (position < puVar42) {
            pvVar8 = (hasher->privat)._H40.extra[0];
            pvVar10 = (hasher->privat)._H40.extra[1];
            uVar50 = (hasher->privat)._H42.free_slot_idx[0];
            do {
              uVar44 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar27 = (ulong)uVar44;
              uVar23 = position - *(uint *)((long)pvVar8 + uVar27 * 4);
              *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar44;
              if (0xfffe < uVar23) {
                uVar23 = 0xffff;
              }
              uVar18 = uVar50 + 1;
              *(short *)((long)pvVar10 + (ulong)uVar50 * 4) = (short)uVar23;
              *(undefined2 *)((long)pvVar10 + (ulong)uVar50 * 4 + 2) =
                   *(undefined2 *)((long)pvVar8 + uVar27 * 2 + 0x20000);
              *(int *)((long)pvVar8 + uVar27 * 4) = (int)position;
              *(ushort *)((long)pvVar8 + uVar27 * 2 + 0x20000) = uVar50;
              local_e8 = local_e8 + 2;
              position = position + 2;
              uVar50 = uVar18;
            } while (position < puVar42);
            goto LAB_00309015;
          }
        }
      }
      else {
        uVar50 = (hasher->privat)._H42.free_slot_idx[0];
        iVar31 = 0;
        do {
          puVar39 = local_130;
          local_140 = (uint32_t *)((long)local_140 + -1);
          puVar40 = (uint32_t *)((long)local_e0 - 1U);
          if (local_140 <= (uint32_t *)((long)local_e0 - 1U)) {
            puVar40 = local_140;
          }
          if (4 < params->quality) {
            puVar40 = (uint32_t *)0x0;
          }
          puVar33 = (uint32_t *)((long)local_130 + 1);
          puVar62 = puVar32;
          if (puVar33 < puVar32) {
            puVar62 = puVar33;
          }
          puVar55 = (uint32_t *)((long)local_130 + sVar5 + 1);
          if (puVar32 <= puVar55) {
            puVar55 = puVar32;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_94 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_a8 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)local_130 & ringbuffer_mask]]];
            local_a8 = (ulong)ringbuffer[(ulong)local_130 & ringbuffer_mask];
          }
          pBVar7 = (params->dictionary).contextual.dict[local_94];
          puVar42 = (uint8_t *)(params->dist).max_distance;
          pvVar8 = (hasher->privat)._H40.extra[0];
          pvVar10 = (hasher->privat)._H40.extra[1];
          uVar27 = (ulong)puVar33 & ringbuffer_mask;
          puVar21 = (ulong *)(ringbuffer + uVar27);
          uVar44 = (uint)(*(int *)(ringbuffer + uVar27) * 0x1e35a7bd) >> 0x11;
          local_148 = (uint32_t *)0x7e4;
          lVar22 = 0;
          puVar24 = (uint32_t *)0x0;
          local_f8 = (uint8_t *)0x0;
          puVar63 = (uint32_t *)0x7e4;
          do {
            puVar36 = (uint8_t *)(long)dist_cache[lVar22];
            puVar28 = (uint8_t *)((long)puVar33 - (long)puVar36);
            cVar54 = (char)uVar44;
            if (((lVar22 == 0) ||
                (*(char *)((long)pvVar8 + ((ulong)puVar28 & 0xffff) + 0x30000) == cVar54)) &&
               ((puVar36 <= puVar62 && (puVar28 < puVar33)))) {
              puVar29 = (ulong *)(ringbuffer + ((ulong)puVar28 & ringbuffer_mask));
              puVar35 = puVar21;
              puVar30 = puVar29;
              for (puVar34 = local_140; (uint32_t *)0x7 < puVar34; puVar34 = puVar34 + -2) {
                uVar23 = *puVar35;
                uVar38 = *puVar30;
                if (uVar23 == uVar38) {
                  puVar30 = puVar30 + 1;
                }
                else {
                  uVar57 = 0;
                  if ((uVar38 ^ uVar23) != 0) {
                    for (; ((uVar38 ^ uVar23) >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                    }
                  }
                  local_120 = (uint32_t *)
                              ((long)puVar30 + ((uVar57 >> 3 & 0x1fffffff) - (long)puVar29));
                }
                if (uVar23 != uVar38) goto LAB_00308004;
                puVar35 = puVar35 + 1;
              }
              puVar25 = puVar30;
              if (puVar34 != (uint32_t *)0x0) {
                puVar25 = (ulong *)((long)puVar30 + (long)puVar34);
                puVar28 = (uint8_t *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar30 + (long)puVar28) !=
                      *(uint8_t *)((long)puVar35 + (long)puVar28)) {
                    puVar25 = (ulong *)((long)puVar30 + (long)puVar28);
                    break;
                  }
                  puVar28 = puVar28 + 1;
                } while (puVar34 != (uint32_t *)puVar28);
              }
              local_120 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_00308004:
              if (((uint32_t *)0x1 < local_120) &&
                 (puVar34 = (uint32_t *)((long)local_120 * 0x87 + 0x78f), local_148 < puVar34)) {
                if (lVar22 != 0) {
                  puVar34 = (uint32_t *)
                            ((long)puVar34 -
                            (ulong)((0x1ca10U >> ((byte)lVar22 & 0xe) & 0xe) + 0x27));
                }
                if (local_148 < puVar34) {
                  puVar63 = puVar34;
                  puVar40 = local_120;
                  puVar24 = local_120;
                  local_148 = puVar34;
                  local_f8 = puVar36;
                }
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != 10);
          uVar38 = (ulong)uVar44;
          sVar64 = (hasher->privat)._H5.block_size_;
          puVar48 = (uint32_t *)((long)puVar33 - (ulong)*(uint *)((long)pvVar8 + uVar38 * 4));
          uVar23 = (ulong)*(ushort *)((long)pvVar8 + uVar38 * 2 + 0x20000);
          puVar28 = (uint8_t *)0x0;
          puVar56 = puVar48;
          puVar34 = local_120;
          do {
            bVar65 = sVar64 == 0;
            sVar64 = sVar64 - 1;
            local_120 = puVar24;
            if (bVar65) break;
            puVar28 = puVar28 + (long)puVar56;
            puVar41 = puVar40;
            puVar53 = puVar63;
            puVar17 = local_148;
            puVar36 = local_f8;
            if (puVar28 <= puVar62) {
              uVar57 = (ulong)*(ushort *)((long)pvVar10 + uVar23 * 4 + 2);
              puVar56 = (uint32_t *)(ulong)*(ushort *)((long)pvVar10 + uVar23 * 4);
              uVar23 = uVar57;
              if ((uint8_t *)((long)puVar40 + uVar27) <= ringbuffer_mask) {
                uVar57 = (long)puVar33 - (long)puVar28 & ringbuffer_mask;
                puVar59 = (uint8_t *)((long)puVar40 + uVar57);
                if ((ringbuffer_mask < puVar59) ||
                   (ringbuffer[(long)((long)puVar40 + uVar27)] != ringbuffer[(long)puVar59]))
                goto LAB_003081ac;
                puVar29 = (ulong *)(ringbuffer + uVar57);
                puVar35 = puVar21;
                puVar30 = puVar29;
                for (puVar41 = local_140; (uint32_t *)0x7 < puVar41; puVar41 = puVar41 + -2) {
                  uVar57 = *puVar35;
                  uVar61 = *puVar30;
                  if (uVar57 == uVar61) {
                    puVar30 = puVar30 + 1;
                  }
                  else {
                    uVar15 = 0;
                    if ((uVar61 ^ uVar57) != 0) {
                      for (; ((uVar61 ^ uVar57) >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    puVar34 = (uint32_t *)
                              ((long)puVar30 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar29));
                  }
                  if (uVar57 != uVar61) goto LAB_003081c9;
                  puVar35 = puVar35 + 1;
                }
                puVar25 = puVar30;
                if (puVar41 != (uint32_t *)0x0) {
                  puVar25 = (ulong *)((long)puVar30 + (long)puVar41);
                  puVar36 = (uint8_t *)0x0;
                  do {
                    if (*(uint8_t *)((long)puVar30 + (long)puVar36) !=
                        *(uint8_t *)((long)puVar35 + (long)puVar36)) {
                      puVar25 = (ulong *)((long)puVar30 + (long)puVar36);
                      break;
                    }
                    puVar36 = puVar36 + 1;
                  } while (puVar41 != (uint32_t *)puVar36);
                }
                puVar34 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_003081c9:
                if ((uint32_t *)0x3 < puVar34) {
                  iVar4 = 0x1f;
                  if ((uint)puVar28 != 0) {
                    for (; (uint)puVar28 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                    }
                  }
                  puVar53 = (uint32_t *)((ulong)(iVar4 * -0x1e + 0x780) + (long)puVar34 * 0x87);
                  puVar41 = puVar34;
                  local_120 = puVar34;
                  puVar17 = puVar53;
                  puVar36 = puVar28;
                  if (local_148 < puVar53) goto LAB_003081ac;
                }
              }
              puVar41 = puVar40;
              puVar53 = puVar63;
              local_120 = puVar24;
              puVar17 = local_148;
              puVar36 = local_f8;
            }
LAB_003081ac:
            local_f8 = puVar36;
            local_148 = puVar17;
            puVar63 = puVar53;
            puVar40 = puVar41;
            puVar34 = local_120;
            puVar24 = local_120;
          } while (puVar28 <= puVar62);
          (hasher->privat)._H42.free_slot_idx[0] = uVar50 + 1;
          *(char *)((long)pvVar8 + ((ulong)puVar33 & 0xffff) + 0x30000) = cVar54;
          if ((uint32_t *)0xfffe < puVar48) {
            puVar48 = (uint32_t *)0xffff;
          }
          *(short *)((long)pvVar10 + (ulong)uVar50 * 4) = (short)puVar48;
          *(undefined2 *)((long)pvVar10 + (ulong)uVar50 * 4 + 2) =
               *(undefined2 *)((long)pvVar8 + uVar38 * 2 + 0x20000);
          *(int *)((long)pvVar8 + uVar38 * 4) = (int)puVar33;
          *(ushort *)((long)pvVar8 + uVar38 * 2 + 0x20000) = uVar50;
          local_150 = 0;
          local_148 = puVar63;
          if ((puVar63 == (uint32_t *)0x7e4) &&
             (pHVar11 = (hasher->privat)._H5.common_,
             pHVar11->dict_num_lookups >> 7 <= pHVar11->dict_num_matches)) {
            uVar23 = (ulong)((uint)((int)*puVar21 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
            puVar28 = pBVar7->hash_table_lengths;
            sVar64 = pHVar11->dict_num_lookups;
            local_150 = 0;
            lVar22 = 0;
            do {
              sVar64 = sVar64 + 1;
              pHVar11->dict_num_lookups = sVar64;
              bVar26 = puVar28[uVar23];
              puVar36 = (uint8_t *)(ulong)bVar26;
              if (puVar36 != (uint8_t *)0x0) {
                bVar65 = true;
                if (puVar36 <= local_140) {
                  pBVar12 = pBVar7->words;
                  puVar30 = (ulong *)(pBVar12->data +
                                     (ulong)pBVar12->offsets_by_length[(long)puVar36] +
                                     (ulong)pBVar7->hash_table_words[uVar23] * (long)puVar36);
                  puVar35 = puVar21;
                  puVar59 = puVar36;
                  if (7 < bVar26) {
                    do {
                      uVar38 = *puVar30;
                      uVar57 = *puVar35;
                      if (uVar38 == uVar57) {
                        puVar35 = puVar35 + 1;
                      }
                      else {
                        uVar61 = 0;
                        if ((uVar57 ^ uVar38) != 0) {
                          for (; ((uVar57 ^ uVar38) >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
                          }
                        }
                        puVar48 = (uint32_t *)
                                  ((long)puVar35 + ((uVar61 >> 3 & 0x1fffffff) - (long)puVar21));
                      }
                      if (uVar38 != uVar57) goto LAB_003083ce;
                      puVar30 = puVar30 + 1;
                      puVar59 = puVar59 + -8;
                    } while ((uint8_t *)0x7 < puVar59);
                  }
                  puVar29 = puVar35;
                  if (puVar59 != (uint8_t *)0x0) {
                    puVar29 = (ulong *)((long)puVar35 + (long)puVar59);
                    puVar60 = (uint8_t *)0x0;
                    do {
                      if (*(uint8_t *)((long)puVar35 + (long)puVar60) !=
                          *(uint8_t *)((long)puVar30 + (long)puVar60)) {
                        puVar29 = (ulong *)((long)puVar35 + (long)puVar60);
                        break;
                      }
                      puVar60 = puVar60 + 1;
                    } while (puVar59 != puVar60);
                  }
                  puVar48 = (uint32_t *)((long)puVar29 - (long)puVar21);
LAB_003083ce:
                  if (((puVar48 != (uint32_t *)0x0) &&
                      (puVar36 < (uint8_t *)((long)puVar48 + (ulong)pBVar7->cutoffTransformsCount)))
                     && (puVar36 = (uint8_t *)
                                   ((long)puVar55 +
                                   ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                                  ((char)((long)puVar36 - (long)puVar48) * '\x06' &
                                                  0x3fU)) & 0x3f) +
                                    ((long)puVar36 - (long)puVar48) * 4 <<
                                   (puVar36[(long)pBVar12] & 0x3f)) +
                                   (ulong)pBVar7->hash_table_words[uVar23] + lVar1),
                        puVar36 <= puVar42)) {
                    iVar4 = 0x1f;
                    if ((uint)puVar36 != 0) {
                      for (; (uint)puVar36 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                      }
                    }
                    puVar40 = (uint32_t *)
                              (((long)puVar48 * 0x87 - (ulong)(uint)(iVar4 * 0x1e)) + 0x780);
                    if (local_148 <= puVar40) {
                      local_150 = (uint)bVar26 - (int)puVar48;
                      bVar65 = false;
                      local_120 = puVar48;
                      local_148 = puVar40;
                      local_f8 = puVar36;
                    }
                  }
                }
                if (!bVar65) {
                  pHVar11->dict_num_matches = pHVar11->dict_num_matches + 1;
                }
              }
              uVar23 = uVar23 + 1;
              bVar65 = lVar22 == 0;
              lVar22 = lVar22 + 1;
            } while (bVar65);
          }
          sVar64 = (params->dictionary).compound.num_chunks;
          if (sVar64 != 0) {
            sVar37 = 0;
            do {
              pPVar9 = (params->dictionary).compound.chunks[sVar37];
              bVar26 = (byte)pPVar9->bucket_bits;
              bVar49 = (byte)pPVar9->slot_bits;
              lVar22 = 1L << (bVar26 & 0x3f);
              bVar16 = -(char)pPVar9->hash_bits;
              uVar23 = ((*puVar21 << (bVar16 & 0x3f)) >> (bVar16 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                       (-bVar26 & 0x3f);
              puVar62 = &pPVar9[1].magic + (1L << (bVar49 & 0x3f));
              bVar49 = -bVar49;
              puVar40 = (uint32_t *)((long)puVar62 + (ulong)pPVar9->num_items * 4 + lVar22 * 2);
              if (pPVar9->magic != 0xdebcede0) {
                puVar40 = *(uint32_t **)puVar40;
              }
              puVar42 = (uint8_t *)
                        ((long)puVar55 +
                        ((params->dictionary).compound.total_size -
                        (params->dictionary).compound.chunk_offsets[sVar37]));
              uVar38 = (ulong)pPVar9->source_size;
              uVar18 = *(ushort *)((long)puVar62 + (uVar23 & 0xffffffff) * 2);
              puVar47 = (uint *)((long)puVar62 +
                                (ulong)((uint)uVar18 +
                                       (&pPVar9[1].magic)
                                       [(uint)((int)uVar23 << (bVar49 & 0x1f)) >> (bVar49 & 0x1f)])
                                * 4 + lVar22 * 2);
              lVar22 = 0;
              puVar63 = local_120;
              do {
                puVar28 = (uint8_t *)(long)dist_cache[lVar22];
                if ((puVar42 + -uVar38 < puVar28) && (puVar28 <= puVar42)) {
                  puVar62 = (uint32_t *)(uVar38 - ((long)puVar42 - (long)puVar28));
                  if (local_140 <= puVar62) {
                    puVar62 = local_140;
                  }
                  puVar29 = (ulong *)((long)puVar40 + ((long)puVar42 - (long)puVar28));
                  puVar35 = puVar21;
                  puVar30 = puVar29;
                  puVar24 = puVar40;
                  for (; (uint32_t *)0x7 < puVar62; puVar62 = puVar62 + -2) {
                    uVar23 = *puVar35;
                    uVar57 = *puVar30;
                    if (uVar23 == uVar57) {
                      puVar30 = puVar30 + 1;
                    }
                    else {
                      uVar61 = 0;
                      if ((uVar57 ^ uVar23) != 0) {
                        for (; ((uVar57 ^ uVar23) >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
                        }
                      }
                      puVar24 = (uint32_t *)
                                ((long)puVar30 + ((uVar61 >> 3 & 0x1fffffff) - (long)puVar29));
                    }
                    if (uVar23 != uVar57) goto LAB_0030864d;
                    puVar35 = puVar35 + 1;
                  }
                  puVar25 = puVar30;
                  if (puVar62 != (uint32_t *)0x0) {
                    puVar25 = (ulong *)((long)puVar30 + (long)puVar62);
                    puVar36 = (uint8_t *)0x0;
                    do {
                      if (*(uint8_t *)((long)puVar30 + (long)puVar36) !=
                          *(uint8_t *)((long)puVar35 + (long)puVar36)) {
                        puVar25 = (ulong *)((long)puVar30 + (long)puVar36);
                        break;
                      }
                      puVar36 = puVar36 + 1;
                    } while (puVar62 != (uint32_t *)puVar36);
                  }
                  puVar24 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_0030864d:
                  if (((uint32_t *)0x1 < puVar24) &&
                     (puVar34 = (uint32_t *)((long)puVar24 * 0x87 + 0x78f), local_148 < puVar34)) {
                    if (lVar22 != 0) {
                      puVar34 = (uint32_t *)
                                ((long)puVar34 -
                                (ulong)((0x1ca10U >> ((byte)lVar22 & 2) & 4) + 0x27));
                    }
                    if (local_148 < puVar34) {
                      if (puVar63 < puVar24) {
                        puVar63 = puVar24;
                      }
                      local_150 = 0;
                      local_148 = puVar34;
                      local_120 = puVar24;
                      local_f8 = puVar28;
                    }
                  }
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              if (uVar18 != 0xffff) {
                do {
                  uVar44 = *puVar47;
                  uVar23 = (ulong)(uVar44 & 0x7fffffff);
                  puVar28 = puVar42 + -uVar23;
                  puVar24 = (uint32_t *)(uVar38 - uVar23);
                  if (local_140 <= (uint32_t *)(uVar38 - uVar23)) {
                    puVar24 = local_140;
                  }
                  if ((((puVar28 <= (uint8_t *)(params->dist).max_distance) &&
                       ((uint8_t *)((long)puVar63 + uVar27) <= ringbuffer_mask)) &&
                      (puVar63 < puVar24)) &&
                     (ringbuffer[(long)((long)puVar63 + uVar27)] ==
                      *(uint8_t *)((long)puVar40 + (long)((long)puVar63 + uVar23)))) {
                    puVar29 = (ulong *)((long)puVar40 + uVar23);
                    puVar35 = puVar21;
                    puVar30 = puVar29;
                    for (; (uint32_t *)0x7 < puVar24; puVar24 = puVar24 + -2) {
                      uVar23 = *puVar35;
                      uVar57 = *puVar30;
                      if (uVar23 == uVar57) {
                        puVar30 = puVar30 + 1;
                      }
                      else {
                        uVar61 = 0;
                        if ((uVar57 ^ uVar23) != 0) {
                          for (; ((uVar57 ^ uVar23) >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
                          }
                        }
                        puVar62 = (uint32_t *)
                                  ((long)puVar30 + ((uVar61 >> 3 & 0x1fffffff) - (long)puVar29));
                      }
                      if (uVar23 != uVar57) goto LAB_003087b1;
                      puVar35 = puVar35 + 1;
                    }
                    puVar25 = puVar30;
                    if (puVar24 != (uint32_t *)0x0) {
                      puVar25 = (ulong *)((long)puVar30 + (long)puVar24);
                      puVar36 = (uint8_t *)0x0;
                      do {
                        if (*(uint8_t *)((long)puVar30 + (long)puVar36) !=
                            *(uint8_t *)((long)puVar35 + (long)puVar36)) {
                          puVar25 = (ulong *)((long)puVar30 + (long)puVar36);
                          break;
                        }
                        puVar36 = puVar36 + 1;
                      } while (puVar24 != (uint32_t *)puVar36);
                    }
                    puVar62 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_003087b1:
                    if ((uint32_t *)0x3 < puVar62) {
                      iVar4 = 0x1f;
                      if ((uint)puVar28 != 0) {
                        for (; (uint)puVar28 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                        }
                      }
                      puVar24 = (uint32_t *)((ulong)(iVar4 * -0x1e + 0x780) + (long)puVar62 * 0x87);
                      if (local_148 < puVar24) {
                        local_150 = 0;
                        puVar63 = puVar62;
                        local_148 = puVar24;
                        local_120 = puVar62;
                        local_f8 = puVar28;
                      }
                    }
                  }
                  puVar47 = puVar47 + 1;
                } while (-1 < (int)uVar44);
              }
              sVar37 = sVar37 + 1;
            } while (sVar37 != sVar64);
          }
          bVar65 = (uint8_t *)((long)local_128 + 0xaf) <= local_148;
          iVar4 = iVar31;
          if (bVar65) {
            local_e8 = local_e8 + 1;
            local_128 = local_148;
            local_110 = local_f8;
            local_154 = local_150;
            local_130 = puVar33;
            local_e0 = local_120;
            iVar4 = iVar31 + 1;
          }
          bVar13 = iVar31 < 3;
          uVar50 = uVar50 + 1;
          iVar31 = iVar4;
        } while (bVar65 && (bVar13 && (uint8_t *)((long)puVar39 + 5U) < puVar3));
        puVar39 = (uint32_t *)((long)local_130 + sVar5);
        if (puVar32 <= (uint32_t *)((long)local_130 + sVar5)) {
          puVar39 = puVar32;
        }
        puVar42 = (uint8_t *)((long)puVar39 + sVar6);
        if (puVar42 < local_110) {
LAB_00308cdb:
          puVar28 = local_110 + 0xf;
        }
        else {
          uVar44 = 0;
          bVar65 = false;
          if (local_110 != (uint8_t *)(long)*dist_cache) {
            if (local_110 == (uint8_t *)(long)dist_cache[1]) {
              uVar44 = 1;
            }
            else {
              if (local_110 + (3 - (long)*dist_cache) < (uint8_t *)0x7) {
                bVar26 = (byte)((int)(local_110 + (3 - (long)*dist_cache)) << 2);
                uVar44 = 0x9750468;
              }
              else {
                if ((uint8_t *)0x6 < local_110 + (3 - (long)dist_cache[1])) {
                  if (local_110 != (uint8_t *)(long)dist_cache[2]) {
                    bVar65 = local_110 != (uint8_t *)(long)dist_cache[3];
                    uVar44 = 3;
                    goto LAB_00308cd2;
                  }
                  uVar44 = 2;
                  goto LAB_00308cd0;
                }
                bVar26 = (byte)((int)(local_110 + (3 - (long)dist_cache[1])) << 2);
                uVar44 = 0xfdb1ace;
              }
              uVar44 = uVar44 >> (bVar26 & 0x1f) & 0xf;
            }
LAB_00308cd0:
            bVar65 = false;
          }
LAB_00308cd2:
          if (bVar65) goto LAB_00308cdb;
          puVar28 = (uint8_t *)(ulong)uVar44;
        }
        if ((local_110 <= puVar42) && (puVar28 != (uint8_t *)0x0)) {
          dist_cache[3] = dist_cache[2];
          *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
          iVar31 = (int)local_110;
          *dist_cache = iVar31;
          dist_cache[4] = iVar31 + -1;
          dist_cache[5] = iVar31 + 1;
          dist_cache[6] = iVar31 + -2;
          dist_cache[7] = iVar31 + 2;
          dist_cache[8] = iVar31 + -3;
          dist_cache[9] = iVar31 + 3;
        }
        uVar44 = (uint)local_e8;
        local_b8->insert_len_ = uVar44;
        local_b8->copy_len_ = local_154 << 0x19 | (uint)local_e0;
        uVar27 = (ulong)(params->dist).num_direct_distance_codes;
        puVar42 = (uint8_t *)(uVar27 + 0x10);
        if (puVar28 < puVar42) {
          local_b8->dist_prefix_ = (uint16_t)puVar28;
          uVar19 = 0;
        }
        else {
          uVar19 = (params->dist).distance_postfix_bits;
          bVar26 = (byte)uVar19;
          puVar28 = puVar28 + ((4L << (bVar26 & 0x3f)) - uVar27) + -0x10;
          uVar45 = 0x1f;
          if ((uint)puVar28 != 0) {
            for (; (uint)puVar28 >> uVar45 == 0; uVar45 = uVar45 - 1) {
            }
          }
          uVar45 = (uVar45 ^ 0xffffffe0) + 0x1f;
          bVar65 = ((ulong)puVar28 >> ((ulong)uVar45 & 0x3f) & 1) != 0;
          iVar31 = uVar45 - uVar19;
          local_b8->dist_prefix_ =
               (short)((uint)bVar65 + iVar31 * 2 + 0xfffe << (bVar26 & 0x3f)) +
               (short)puVar42 + (~(ushort)(-1 << (bVar26 & 0x1f)) & (ushort)puVar28) |
               (short)iVar31 * 0x400;
          uVar19 = (uint32_t)
                   ((long)puVar28 - ((ulong)bVar65 + 2 << ((byte)uVar45 & 0x3f)) >> (bVar26 & 0x3f))
          ;
        }
        local_b8->dist_extra_ = uVar19;
        if (5 < local_e8) {
          if (local_e8 < 0x82) {
            uVar44 = 0x1f;
            uVar45 = (uint)(local_e8 - 2);
            if (uVar45 != 0) {
              for (; uVar45 >> uVar44 == 0; uVar44 = uVar44 - 1) {
              }
            }
            uVar44 = (int)(local_e8 - 2 >> ((char)(uVar44 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar44 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_e8 < 0x842) {
            uVar45 = 0x1f;
            if (uVar44 - 0x42 != 0) {
              for (; uVar44 - 0x42 >> uVar45 == 0; uVar45 = uVar45 - 1) {
              }
            }
            uVar44 = (uVar45 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar44 = 0x15;
            if (0x1841 < local_e8) {
              uVar44 = (uint)(ushort)(0x17 - (local_e8 < 0x5842));
            }
          }
        }
        uVar45 = local_154 + (uint)local_e0;
        if (uVar45 < 10) {
          uVar46 = uVar45 - 2;
        }
        else if (uVar45 < 0x86) {
          uVar45 = uVar45 - 6;
          uVar46 = 0x1f;
          if (uVar45 != 0) {
            for (; uVar45 >> uVar46 == 0; uVar46 = uVar46 - 1) {
            }
          }
          uVar46 = (int)((ulong)(long)(int)uVar45 >> ((char)(uVar46 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar46 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar46 = 0x17;
          if (uVar45 < 0x846) {
            uVar46 = 0x1f;
            if (uVar45 - 0x46 != 0) {
              for (; uVar45 - 0x46 >> uVar46 == 0; uVar46 = uVar46 - 1) {
              }
            }
            uVar46 = (uVar46 ^ 0xffe0) + 0x2c;
          }
        }
        uVar50 = (ushort)uVar46;
        uVar43 = (uVar50 & 7) + ((ushort)uVar44 & 7) * 8;
        if ((((local_b8->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar44 < 8)) && (uVar50 < 0x10)) {
          if (7 < uVar50) {
            uVar43 = uVar43 + 0x40;
          }
        }
        else {
          iVar31 = ((uVar44 & 0xffff) >> 3) * 3 + ((uVar46 & 0xffff) >> 3);
          uVar43 = uVar43 + ((ushort)(0x520d40 >> ((char)iVar31 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar31 * 0x40 + 0x40;
        }
        local_b8->cmd_prefix_ = uVar43;
        *num_literals = *num_literals + local_e8;
        position = (long)local_130 + (long)local_e0;
        puVar39 = puVar20;
        if (position < puVar20) {
          puVar39 = (uint32_t *)position;
        }
        puVar40 = (uint32_t *)((long)local_130 + 2);
        if (local_110 < (uint8_t *)((ulong)local_e0 >> 2)) {
          puVar33 = (uint32_t *)(position + -(long)local_110 * 4);
          if ((uint32_t *)(position + -(long)local_110 * 4) < puVar40) {
            puVar33 = puVar40;
          }
          puVar40 = puVar33;
          if (puVar39 < puVar33) {
            puVar40 = puVar39;
          }
        }
        local_d0 = (uint8_t *)((long)local_130 + lVar51 + (long)local_e0 * 2);
        local_b8 = local_b8 + 1;
        if (puVar40 < puVar39) {
          pvVar8 = (hasher->privat)._H40.extra[0];
          pvVar10 = (hasher->privat)._H40.extra[1];
          uVar50 = (hasher->privat)._H42.free_slot_idx[0];
          do {
            uVar44 = (uint)(*(int *)(ringbuffer + ((ulong)puVar40 & ringbuffer_mask)) * 0x1e35a7bd)
                     >> 0x11;
            uVar27 = (ulong)uVar44;
            uVar23 = (long)puVar40 - (ulong)*(uint *)((long)pvVar8 + uVar27 * 4);
            *(char *)((long)pvVar8 + ((ulong)puVar40 & 0xffff) + 0x30000) = (char)uVar44;
            if (0xfffe < uVar23) {
              uVar23 = 0xffff;
            }
            uVar18 = uVar50 + 1;
            *(short *)((long)pvVar10 + (ulong)uVar50 * 4) = (short)uVar23;
            *(undefined2 *)((long)pvVar10 + (ulong)uVar50 * 4 + 2) =
                 *(undefined2 *)((long)pvVar8 + uVar27 * 2 + 0x20000);
            *(int *)((long)pvVar8 + uVar27 * 4) = (int)puVar40;
            *(ushort *)((long)pvVar8 + uVar27 * 2 + 0x20000) = uVar50;
            puVar40 = (uint32_t *)((long)puVar40 + 1);
            uVar50 = uVar18;
          } while (puVar39 != puVar40);
          local_e8 = 0;
LAB_00309015:
          (hasher->privat)._H42.free_slot_idx[0] = uVar18;
        }
        else {
          local_e8 = 0;
        }
      }
LAB_0030903c:
      local_130 = (uint32_t *)position;
    } while ((uint32_t *)(position + 4) < puVar3);
  }
  else {
    local_b8 = commands;
  }
  *last_insert_len = (size_t)(puVar3 + (local_e8 - position));
  *num_commands = *num_commands + ((long)local_b8 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}